

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_backend.cpp
# Opt level: O2

void __thiscall
booster::locale::impl_std::std_localization_backend::set_option
          (std_localization_backend *this,string *name,string *value)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  this->invalid_ = true;
  bVar1 = std::operator==(name,"locale");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&this->locale_id_);
    return;
  }
  bVar1 = std::operator==(name,"message_path");
  if (bVar1) {
    this_00 = &this->paths_;
  }
  else {
    bVar1 = std::operator==(name,"message_application");
    if (!bVar1) {
      bVar1 = std::operator==(name,"use_ansi_encoding");
      if (bVar1) {
        bVar1 = std::operator==(value,"true");
        this->use_ansi_encoding_ = bVar1;
      }
      return;
    }
    this_00 = &this->domains_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(this_00,value);
  return;
}

Assistant:

void set_option(std::string const &name,std::string const &value) 
        {
            invalid_ = true;
            if(name=="locale")
                locale_id_ = value;
            else if(name=="message_path")
                paths_.push_back(value);
            else if(name=="message_application")
                domains_.push_back(value);
            else if(name=="use_ansi_encoding")
                use_ansi_encoding_ = value == "true";

        }